

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_tri_metric_area(REF_NODE ref_node,REF_INT *nodes,REF_DBL *area)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  char *pcVar4;
  REF_DBL det;
  REF_DBL m [6];
  REF_DBL mlog [6];
  REF_DBL mlog2 [6];
  REF_DBL mlog1 [6];
  REF_DBL mlog0 [6];
  double local_120;
  REF_DBL local_118 [6];
  REF_DBL local_e8 [6];
  REF_DBL local_b8 [6];
  REF_DBL local_88 [6];
  REF_DBL local_58 [7];
  
  uVar1 = ref_node_tri_area(ref_node,nodes,area);
  if (uVar1 == 0) {
    ref_node_metric_get_log(ref_node,*nodes,local_58);
    ref_node_metric_get_log(ref_node,nodes[1],local_88);
    ref_node_metric_get_log(ref_node,nodes[2],local_b8);
    for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
      local_e8[lVar2] = (local_58[lVar2] + local_88[lVar2] + local_b8[lVar2]) / 3.0;
    }
    uVar1 = ref_matrix_exp_m(local_e8,local_118);
    if (uVar1 == 0) {
      uVar1 = ref_matrix_det_m(local_118,&local_120);
      if (uVar1 == 0) {
        if (local_120 < 0.0) {
          local_120 = sqrt(local_120);
        }
        else {
          local_120 = SQRT(local_120);
        }
        *area = local_120 * *area * 2.3094010767585034;
        return 0;
      }
      pcVar4 = "det(mavg)";
      uVar3 = 0x938;
    }
    else {
      pcVar4 = "exp";
      uVar3 = 0x937;
    }
  }
  else {
    pcVar4 = "tri area";
    uVar3 = 0x932;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar3,
         "ref_node_tri_metric_area",(ulong)uVar1,pcVar4);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_metric_area(REF_NODE ref_node, REF_INT *nodes,
                                            REF_DBL *area) {
  REF_DBL mlog0[6], mlog1[6], mlog2[6];
  REF_DBL mlog[6], m[6], det;
  REF_INT i;

  RSS(ref_node_tri_area(ref_node, nodes, area), "tri area");
  RSS(ref_node_metric_get_log(ref_node, nodes[0], mlog0), "log0");
  RSS(ref_node_metric_get_log(ref_node, nodes[1], mlog1), "log1");
  RSS(ref_node_metric_get_log(ref_node, nodes[2], mlog2), "log2");
  for (i = 0; i < 6; i++) mlog[i] = (mlog0[i] + mlog1[i] + mlog2[i]) / 3.0;
  RSS(ref_matrix_exp_m(mlog, m), "exp");
  RSS(ref_matrix_det_m(m, &det), "det(mavg)");
  (*area) *= sqrt(det);
  (*area) *= 4.0 / sqrt(3.0);

  return REF_SUCCESS;
}